

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger array_reduce(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQArray *this;
  SQObjectValue SVar3;
  uint uVar4;
  SQDelegable *pSVar5;
  SQObjectPtr *pSVar6;
  SQInteger SVar7;
  SQObjectPtr *pSVar8;
  SQRESULT SVar9;
  SQUnsignedInteger nidx;
  SQObjectPtr res;
  SQObjectPtr other;
  SQObjectPtr local_68;
  SQUnsignedInteger local_58;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  pSVar6 = SQVM::GetAt(v,v->_stackbase);
  this = (pSVar6->super_SQObject)._unVal.pArray;
  local_58 = (this->_values)._size;
  local_68.super_SQObject._type = OT_NULL;
  local_68.super_SQObject._unVal.pTable = (SQTable *)0x0;
  SVar7 = sq_gettop(v);
  if (SVar7 < 3) {
    if (local_58 == 0) {
      SVar7 = 0;
      goto LAB_00129179;
    }
    nidx = 1;
    SQArray::Get(this,0,&local_68);
  }
  else {
    pSVar8 = SQVM::GetAt(v,v->_stackbase + 2);
    SVar3 = (SQObjectValue)(pSVar8->super_SQObject)._unVal.pTable;
    SVar2 = (pSVar8->super_SQObject)._type;
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &((SVar3.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    uVar4 = local_68.super_SQObject._type >> 0x1b;
    local_68.super_SQObject._type = SVar2;
    if ((uVar4 & 1) != 0) {
      pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        pSVar5 = &(local_68.super_SQObject._unVal.pTable)->super_SQDelegable;
        local_68.super_SQObject._unVal = SVar3;
        (*(pSVar5->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
        SVar3 = local_68.super_SQObject._unVal;
      }
    }
    local_68.super_SQObject._unVal = SVar3;
    nidx = 0;
  }
  if ((long)nidx < (long)local_58) {
    local_50.super_SQObject._type = OT_NULL;
    local_50.super_SQObject._unVal.pTable = (SQTable *)0x0;
    pSVar8 = SQVM::GetAt(v,v->_stackbase + 1);
    SQVM::Push(v,pSVar8);
    do {
      SQArray::Get(this,nidx,&local_50);
      local_40.super_SQObject._type = (pSVar6->super_SQObject)._type;
      local_40.super_SQObject._unVal = (SQObjectValue)(pSVar6->super_SQObject)._unVal.pTable;
      if ((local_40.super_SQObject._type >> 0x1b & 1) != 0) {
        pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      SQVM::Push(v,&local_40);
      SQObjectPtr::~SQObjectPtr(&local_40);
      SQVM::Push(v,&local_68);
      SQVM::Push(v,&local_50);
      SVar9 = sq_call(v,3,1,0);
      if (SVar9 < 0) {
        SQObjectPtr::~SQObjectPtr(&local_50);
        SVar7 = -1;
        goto LAB_00129179;
      }
      pSVar8 = SQVM::GetUp(v,-1);
      SVar3 = (SQObjectValue)(pSVar8->super_SQObject)._unVal.pTable;
      SVar2 = (pSVar8->super_SQObject)._type;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &((SVar3.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      uVar4 = local_68.super_SQObject._type >> 0x1b;
      local_68.super_SQObject._type = SVar2;
      if ((uVar4 & 1) != 0) {
        pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          pSVar5 = &(local_68.super_SQObject._unVal.pTable)->super_SQDelegable;
          local_68.super_SQObject._unVal = SVar3;
          (*(pSVar5->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
          SVar3 = local_68.super_SQObject._unVal;
        }
      }
      local_68.super_SQObject._unVal = SVar3;
      SQVM::Pop(v);
      nidx = nidx + 1;
    } while (local_58 != nidx);
    SQVM::Pop(v);
    SQObjectPtr::~SQObjectPtr(&local_50);
  }
  SVar7 = 1;
  SQVM::Push(v,&local_68);
LAB_00129179:
  SQObjectPtr::~SQObjectPtr(&local_68);
  return SVar7;
}

Assistant:

static SQInteger array_reduce(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQArray *a = _array(o);
    SQInteger size = a->Size();
    SQObjectPtr res;
    SQInteger iterStart;
    if (sq_gettop(v)>2) {
        res = stack_get(v,3);
        iterStart = 0;
    } else if (size==0) {
        return 0;
    } else {
        a->Get(0,res);
        iterStart = 1;
    }
    if (size > iterStart) {
        SQObjectPtr other;
        v->Push(stack_get(v,2));
        for (SQInteger n = iterStart; n < size; n++) {
            a->Get(n,other);
            v->Push(o);
            v->Push(res);
            v->Push(other);
            if(SQ_FAILED(sq_call(v,3,SQTrue,SQFalse))) {
                return SQ_ERROR;
            }
            res = v->GetUp(-1);
            v->Pop();
        }
        v->Pop();
    }
    v->Push(res);
    return 1;
}